

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,SyMemBackend *pParent)

{
  SyMutexMethods *pSVar1;
  ulong uVar2;
  SyMutex *pSVar3;
  
  uVar2 = 0xfffffffffffffffc;
  do {
    *(undefined4 *)((long)pBackend->apPool + (uVar2 - 0x3c)) = 0;
    uVar2 = uVar2 + 4;
  } while (uVar2 < 0xb4);
  pBackend->pMethods = pParent->pMethods;
  pBackend->xMemError = pParent->xMemError;
  pBackend->pUserData = pParent->pUserData;
  pSVar1 = pParent->pMutexMethods;
  if (pSVar1 != (SyMutexMethods *)0x0) {
    pBackend->pMutexMethods = pSVar1;
    pSVar3 = (*pSVar1->xNew)(1);
    pBackend->pMutex = pSVar3;
    if (pSVar3 == (SyMutex *)0x0) {
      return -0x17;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInitFromParent(SyMemBackend *pBackend,const SyMemBackend *pParent)
{
	sxu8 bInheritMutex;
#if defined(UNTRUST)
	if( pBackend == 0 || SXMEM_BACKEND_CORRUPT(pParent) ){
		return SXERR_CORRUPT;
	}
#endif
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->pMethods  = pParent->pMethods;
	pBackend->xMemError = pParent->xMemError;
	pBackend->pUserData = pParent->pUserData;
	bInheritMutex = pParent->pMutexMethods ? TRUE : FALSE;
	if( bInheritMutex ){
		pBackend->pMutexMethods = pParent->pMutexMethods;
		/* Create a private mutex */
		pBackend->pMutex = pBackend->pMutexMethods->xNew(SXMUTEX_TYPE_FAST);
		if( pBackend->pMutex ==  0){
			return SXERR_OS;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}